

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O2

golf_bvh_node_info_t *
golf_bvh_node_info(golf_bvh_node_info_t *__return_storage_ptr__,golf_bvh_t *bvh,int idx,
                  golf_level_t *level,golf_entity_t *entity,float t)

{
  golf_bvh_aabb_t *aabb;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vec3 *pvVar7;
  vec3 *pvVar8;
  golf_bvh_face_t *pgVar9;
  golf_transform_t transform_00;
  golf_transform_t transform_01;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  float fVar10;
  _Bool _Var11;
  int iVar12;
  golf_model_t *pgVar13;
  golf_movement_t *pgVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int j;
  golf_model_group_t *pgVar18;
  golf_model_group_t *pgVar19;
  byte bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  vec3 vVar24;
  vec3 vVar25;
  vec3 vVar26;
  vec3 vVar27;
  float fVar28;
  mat4 model_mat;
  golf_transform_t local_9a8;
  float local_978;
  float fStack_974;
  undefined8 uStack_970;
  golf_transform_t transform;
  golf_model_group_t group;
  golf_material_t material;
  golf_material_t local_490;
  
  bVar20 = 0;
  pgVar13 = golf_entity_get_model(entity);
  golf_entity_get_world_transform(&transform,level,entity);
  pgVar14 = golf_entity_get_movement(entity);
  __return_storage_ptr__->idx = idx;
  __return_storage_ptr__->face_start = (bvh->faces).length;
  __return_storage_ptr__->face_count = (pgVar13->positions).length / 3;
  vVar24 = vec3_create(0.0,0.0,0.0);
  (__return_storage_ptr__->pos).x = (float)(int)vVar24._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = vVar24.z;
  vVar24 = vec3_create(3.4028235e+38,3.4028235e+38,3.4028235e+38);
  (__return_storage_ptr__->aabb).min.x = (float)(int)vVar24._0_8_;
  (__return_storage_ptr__->aabb).min.y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->aabb).min.z = vVar24.z;
  vVar24 = vec3_create(1.1754944e-38,1.1754944e-38,1.1754944e-38);
  (__return_storage_ptr__->aabb).max.x = (float)(int)vVar24._0_8_;
  (__return_storage_ptr__->aabb).max.y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->aabb).max.z = vVar24.z;
  local_9a8.scale.y = transform.scale.y;
  local_9a8.scale.z = transform.scale.z;
  local_9a8.rotation.y = transform.rotation.y;
  local_9a8.rotation.z = transform.rotation.z;
  local_9a8.rotation.w = transform.rotation.w;
  local_9a8.scale.x = transform.scale.x;
  local_9a8.position.x = transform.position.x;
  local_9a8.position.y = transform.position.y;
  local_9a8.position.z = transform.position.z;
  local_9a8.rotation.x = transform.rotation.x;
  if (pgVar14 != (golf_movement_t *)0x0) {
    material.name._31_8_ = *(undefined8 *)((long)&pgVar14->field_4 + 0x10);
    material._0_8_ = *(undefined8 *)pgVar14;
    material.name._7_8_ = *(undefined8 *)&pgVar14->t0;
    material.name._15_8_ = *(undefined8 *)&pgVar14->field_4;
    material.name._23_8_ = *(undefined8 *)((long)&pgVar14->field_4 + 8);
    transform_00.position.z = transform.position.z;
    transform_00.rotation.x = transform.rotation.x;
    transform_00.position.x = transform.position.x;
    transform_00.position.y = transform.position.y;
    transform_00.rotation.y = transform.rotation.y;
    transform_00.rotation.z = transform.rotation.z;
    transform_00.rotation.w = transform.rotation.w;
    transform_00.scale.x = transform.scale.x;
    transform_00.scale.y = transform.scale.y;
    transform_00.scale.z = transform.scale.z;
    golf_transform_apply_movement(&local_9a8,transform_00,*pgVar14,t);
  }
  aabb = &__return_storage_ptr__->aabb;
  transform_01.position.z = local_9a8.position.z;
  transform_01.rotation.x = local_9a8.rotation.x;
  transform_01.position.x = local_9a8.position.x;
  transform_01.position.y = local_9a8.position.y;
  transform_01.rotation.y = local_9a8.rotation.y;
  transform_01.rotation.z = local_9a8.rotation.z;
  transform_01.rotation.w = local_9a8.rotation.w;
  transform_01.scale.x = local_9a8.scale.x;
  transform_01.scale.y = local_9a8.scale.y;
  transform_01.scale.z = local_9a8.scale.z;
  golf_transform_get_model_mat(transform_01);
  for (lVar17 = 0; lVar17 < (pgVar13->groups).length; lVar17 = lVar17 + 1) {
    pgVar18 = (pgVar13->groups).data + lVar17;
    pgVar19 = &group;
    for (lVar16 = 0x12; lVar16 != 0; lVar16 = lVar16 + -1) {
      *(undefined4 *)pgVar19->material_name = *(undefined4 *)pgVar18->material_name;
      pgVar18 = (golf_model_group_t *)((long)pgVar18 + ((ulong)bVar20 * -2 + 1) * 4);
      pgVar19 = (golf_model_group_t *)((long)pgVar19 + (ulong)bVar20 * -8 + 4);
    }
    _Var11 = golf_level_get_material(level,group.material_name,&material);
    if (!_Var11) {
      golf_material_texture(&local_490,"",0.0,0.0,0.0,"data/textures/fallback.png");
      memcpy(&material,&local_490,0x460);
    }
    for (lVar16 = 0; lVar16 < group.vertex_count; lVar16 = lVar16 + 3) {
      pvVar7 = (pgVar13->positions).data;
      lVar15 = (long)(group.start_vertex + (int)lVar16);
      pvVar8 = pvVar7 + lVar15;
      uVar1 = pvVar8->x;
      uVar4 = pvVar8->y;
      vVar24.y = (float)uVar4;
      vVar24.x = (float)uVar1;
      fVar21 = model_mat.m[4];
      fVar22 = model_mat.m[5];
      fVar23 = model_mat.m[6];
      fVar28 = model_mat.m[7];
      m.m._8_8_ = model_mat.m._8_8_;
      m.m._0_8_ = model_mat.m._0_8_;
      m.m[4] = fVar21;
      m.m[5] = fVar22;
      m.m[6] = fVar23;
      m.m[7] = fVar28;
      m.m._32_8_ = model_mat.m._32_8_;
      m.m._40_8_ = model_mat.m._40_8_;
      m.m._48_8_ = model_mat.m._48_8_;
      m.m._56_8_ = model_mat.m._56_8_;
      vVar24.z = pvVar7[lVar15].z;
      vVar24 = vec3_apply_mat4(vVar24,1.0,m);
      pvVar7 = (pgVar13->positions).data;
      pvVar8 = pvVar7 + lVar15 + 1;
      uVar2 = pvVar8->x;
      uVar5 = pvVar8->y;
      vVar25.y = (float)uVar5;
      vVar25.x = (float)uVar2;
      m_00.m._8_8_ = model_mat.m._8_8_;
      m_00.m._0_8_ = model_mat.m._0_8_;
      m_00.m[4] = fVar21;
      m_00.m[5] = fVar22;
      m_00.m[6] = fVar23;
      m_00.m[7] = fVar28;
      m_00.m._32_8_ = model_mat.m._32_8_;
      m_00.m._40_8_ = model_mat.m._40_8_;
      m_00.m._48_8_ = model_mat.m._48_8_;
      m_00.m._56_8_ = model_mat.m._56_8_;
      vVar25.z = pvVar7[lVar15 + 1].z;
      vVar25 = vec3_apply_mat4(vVar25,1.0,m_00);
      pvVar7 = (pgVar13->positions).data;
      pvVar8 = pvVar7 + lVar15 + 2;
      uVar3 = pvVar8->x;
      uVar6 = pvVar8->y;
      vVar26.y = (float)uVar6;
      vVar26.x = (float)uVar3;
      m_01.m._8_8_ = model_mat.m._8_8_;
      m_01.m._0_8_ = model_mat.m._0_8_;
      m_01.m[4] = fVar21;
      m_01.m[5] = fVar22;
      m_01.m[6] = fVar23;
      m_01.m[7] = fVar28;
      m_01.m._32_8_ = model_mat.m._32_8_;
      m_01.m._40_8_ = model_mat.m._40_8_;
      m_01.m._48_8_ = model_mat.m._48_8_;
      m_01.m._56_8_ = model_mat.m._56_8_;
      vVar26.z = pvVar7[lVar15 + 2].z;
      vVar26 = vec3_apply_mat4(vVar26,1.0,m_01);
      vVar27 = vec3_add(__return_storage_ptr__->pos,vVar24);
      vVar27 = vec3_add(vVar27,vVar25);
      vVar27 = vec3_add(vVar27,vVar26);
      fVar10 = material.vel_scale;
      (__return_storage_ptr__->pos).x = (float)(int)vVar27._0_8_;
      (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar27._0_8_ >> 0x20);
      (__return_storage_ptr__->pos).z = vVar27.z;
      local_978 = material.friction;
      fStack_974 = material.restitution;
      uStack_970 = 0;
      if (pgVar13->is_water == true) {
        pvVar8 = (pgVar13->water_dir).data;
        m_02.m._8_8_ = model_mat.m._8_8_;
        m_02.m._0_8_ = model_mat.m._0_8_;
        m_02.m[4] = fVar21;
        m_02.m[5] = fVar22;
        m_02.m[6] = fVar23;
        m_02.m[7] = fVar28;
        m_02.m._32_8_ = model_mat.m._32_8_;
        m_02.m._40_8_ = model_mat.m._40_8_;
        m_02.m._48_8_ = model_mat.m._48_8_;
        m_02.m._56_8_ = model_mat.m._56_8_;
        vVar27.z = (&pvVar8->z)[lVar16];
        vVar27._0_8_ = *(undefined8 *)(&pvVar8->x + lVar16);
        vVar27 = vec3_apply_mat4(vVar27,0.0,m_02);
        fVar23 = vVar27.z;
        fVar21 = vVar27.x;
        fVar22 = vVar27.y;
      }
      else {
        vVar27 = vec3_create(0.0,0.0,0.0);
        fVar23 = vVar27.z;
        fVar21 = vVar27.x;
        fVar22 = vVar27.y;
      }
      iVar12 = vec_expand_((char **)bvh,&(bvh->faces).length,&(bvh->faces).capacity,0x58,
                           (bvh->faces).alloc_category);
      if (iVar12 == 0) {
        pgVar9 = (bvh->faces).data;
        iVar12 = (bvh->faces).length;
        (bvh->faces).length = iVar12 + 1;
        pgVar9[iVar12].t = t;
        pgVar9[iVar12].level = level;
        pgVar9[iVar12].entity = entity;
        pgVar9[iVar12].a.x = (float)(int)vVar24._0_8_;
        pgVar9[iVar12].a.y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
        pgVar9[iVar12].a.z = vVar24.z;
        pgVar9[iVar12].b.x = (float)(int)vVar25._0_8_;
        pgVar9[iVar12].b.y = (float)(int)((ulong)vVar25._0_8_ >> 0x20);
        pgVar9[iVar12].b.z = vVar25.z;
        pgVar9[iVar12].c.x = (float)(int)vVar26._0_8_;
        pgVar9[iVar12].c.y = (float)(int)((ulong)vVar26._0_8_ >> 0x20);
        pgVar9[iVar12].c.z = vVar26.z;
        pgVar9[iVar12].water_dir.x = fVar21;
        pgVar9[iVar12].water_dir.y = fVar22;
        pgVar9[iVar12].water_dir.z = fVar23;
        pgVar9[iVar12].restitution = fStack_974;
        pgVar9[iVar12].friction = local_978;
        pgVar9[iVar12].vel_scale = fVar10;
      }
      _update_aabb(aabb,vVar24);
      _update_aabb(aabb,vVar25);
      _update_aabb(aabb,vVar26);
    }
  }
  vVar24 = vec3_scale(__return_storage_ptr__->pos,1.0 / (float)(pgVar13->positions).length);
  (__return_storage_ptr__->pos).x = (float)(int)vVar24._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = vVar24.z;
  return __return_storage_ptr__;
}

Assistant:

golf_bvh_node_info_t golf_bvh_node_info(golf_bvh_t *bvh, int idx, golf_level_t *level, golf_entity_t *entity, float t) {
    golf_model_t *model = golf_entity_get_model(entity);
    golf_transform_t transform = golf_entity_get_world_transform(level, entity);
    golf_movement_t *movement = golf_entity_get_movement(entity);

    golf_bvh_node_info_t info;
    info.idx = idx;
    info.face_start = bvh->faces.length;
    info.face_count = model->positions.length / 3;
    info.pos = V3(0, 0, 0);
    info.aabb.min = V3(FLT_MAX, FLT_MAX, FLT_MAX);
    info.aabb.max = V3(FLT_MIN, FLT_MIN, FLT_MIN);

    golf_transform_t moved_transform = transform;
    if (movement) {
        moved_transform = golf_transform_apply_movement(moved_transform, *movement, t);
    }
    mat4 model_mat = golf_transform_get_model_mat(moved_transform);

    for (int i = 0; i < model->groups.length; i++) {
        golf_model_group_t group = model->groups.data[i];

        golf_material_t material;
        if (!golf_level_get_material(level, group.material_name, &material)) {
            material = golf_material_texture("", 0, 0, 0, "data/textures/fallback.png");
        }

        for (int j = 0; j < group.vertex_count; j += 3) {
            int v_idx = group.start_vertex + j;
            vec3 a = vec3_apply_mat4(model->positions.data[v_idx + 0], 1, model_mat);
            vec3 b = vec3_apply_mat4(model->positions.data[v_idx + 1], 1, model_mat);
            vec3 c = vec3_apply_mat4(model->positions.data[v_idx + 2], 1, model_mat);

            info.pos = vec3_add(info.pos, a);
            info.pos = vec3_add(info.pos, b);
            info.pos = vec3_add(info.pos, c);

            golf_bvh_face_t face;
            face.a = a;
            face.b = b;
            face.c = c;
            face.restitution = material.restitution;
            face.friction = material.friction;
            face.vel_scale = material.vel_scale;
            face.level = level;
            face.entity = entity;
            face.t = t;
            if (model->is_water) {
                face.water_dir = vec3_apply_mat4(model->water_dir.data[j / 3], 0, model_mat);
            }
            else {
                face.water_dir = V3(0, 0, 0);
            }
            vec_push(&bvh->faces, face);

            _update_aabb(&info.aabb, a);
            _update_aabb(&info.aabb, b);
            _update_aabb(&info.aabb, c);
        }
    }

    info.pos = vec3_scale(info.pos, 1.0f / model->positions.length);

    return info;
}